

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O1

int __thiscall
flow::lang::IRGenerator::accept(IRGenerator *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  IRBuilder *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ushort uVar2;
  Value *pVVar3;
  __node_base_ptr p_Var4;
  int iVar5;
  BasicBlock *pBVar6;
  ConstantValue<long,_(flow::LiteralType)2> *arraySize;
  Value *pVVar7;
  Value *extraout_RAX;
  _Hash_node_base *p_Var8;
  Value *extraout_RAX_00;
  socklen_t *__addr_len_00;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  undefined4 in_register_00000034;
  long lVar9;
  IRGenerator *__addr_00;
  __node_base_ptr p_Var10;
  __node_base_ptr p_Var11;
  _Hash_node_base *p_Var12;
  long *plVar13;
  undefined1 local_35b;
  undefined1 local_35a;
  undefined1 local_359;
  BasicBlock *local_358;
  BasicBlock *local_350;
  string local_348 [24];
  
  lVar9 = CONCAT44(in_register_00000034,__fd);
  if ((accept(flow::lang::BinaryExpr&)::ops_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&accept(flow::lang::BinaryExpr&)::ops_abi_cxx11_),
     __addr = extraout_RDX, iVar5 != 0)) {
    memcpy(local_348,&DAT_001af1f0,0x318);
    std::
    _Hashtable<int,std::pair<int_const,flow::Value*(flow::lang::IRGenerator::*)(flow::Value*,flow::Value*,std::__cxx11::string_const&)>,std::allocator<std::pair<int_const,flow::Value*(flow::lang::IRGenerator::*)(flow::Value*,flow::Value*,std::__cxx11::string_const&)>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _Hashtable<std::pair<int_const,flow::Value*(flow::lang::IRGenerator::*)(flow::Value*,flow::Value*,std::__cxx11::string_const&)>const*>
              ((_Hashtable<int,std::pair<int_const,flow::Value*(flow::lang::IRGenerator::*)(flow::Value*,flow::Value*,std::__cxx11::string_const&)>,std::allocator<std::pair<int_const,flow::Value*(flow::lang::IRGenerator::*)(flow::Value*,flow::Value*,std::__cxx11::string_const&)>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&accept(flow::lang::BinaryExpr&)::ops_abi_cxx11_,local_348,
               &stack0xffffffffffffffd0,0,&local_359,&local_35a,&local_35b);
    __cxa_atexit(std::
                 unordered_map<int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
                 ::~unordered_map,&accept(flow::lang::BinaryExpr&)::ops_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&accept(flow::lang::BinaryExpr&)::ops_abi_cxx11_);
    __addr = extraout_RDX_00;
  }
  if (*(short *)(lVar9 + 0x40) == 0x29) {
    paVar1 = &local_348[0].field_2;
    local_348[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"bor.left","");
    this_00 = &this->super_IRBuilder;
    pBVar6 = IRBuilder::createBlock(this_00,local_348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_348[0]._M_dataplus._M_p,local_348[0].field_2._M_allocated_capacity + 1);
    }
    local_348[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"bor.right","");
    local_350 = IRBuilder::createBlock(this_00,local_348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_348[0]._M_dataplus._M_p,local_348[0].field_2._M_allocated_capacity + 1);
    }
    local_348[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"bor.cont","");
    local_358 = IRBuilder::createBlock(this_00,local_348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348[0]._M_dataplus._M_p != &local_348[0].field_2) {
      operator_delete(local_348[0]._M_dataplus._M_p,local_348[0].field_2._M_allocated_capacity + 1);
    }
    local_348[0]._M_dataplus._M_p = (pointer)0x1;
    arraySize = IRProgram::get<flow::ConstantValue<long,(flow::LiteralType)2>,long>
                          (this_00->program_,&this_00->program_->numbers_,(long *)local_348);
    local_348[0]._M_dataplus._M_p = (pointer)&local_348[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"bor","");
    pVVar7 = (Value *)IRBuilder::createAlloca(this_00,Boolean,(Value *)arraySize,local_348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348[0]._M_dataplus._M_p != &local_348[0].field_2) {
      operator_delete(local_348[0]._M_dataplus._M_p,local_348[0].field_2._M_allocated_capacity + 1);
    }
    (**(code **)(**(long **)(lVar9 + 0x48) + 0x10))(*(long **)(lVar9 + 0x48),this);
    pVVar3 = this->result_;
    IRBuilder::createCondBr(this_00,pVVar3,pBVar6,local_350);
    IRBuilder::setInsertPoint(this_00,pBVar6);
    paVar1 = &local_348[0].field_2;
    local_348[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"bor.left","");
    IRBuilder::createStore(this_00,pVVar7,pVVar3,local_348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_348[0]._M_dataplus._M_p,local_348[0].field_2._M_allocated_capacity + 1);
    }
    IRBuilder::createBr(this_00,local_358);
    IRBuilder::setInsertPoint(this_00,local_350);
    (**(code **)(**(long **)(lVar9 + 0x50) + 0x10))(*(long **)(lVar9 + 0x50),this);
    pVVar3 = this->result_;
    local_348[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"bor.right","");
    IRBuilder::createStore(this_00,pVVar7,pVVar3,local_348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_348[0]._M_dataplus._M_p,local_348[0].field_2._M_allocated_capacity + 1);
    }
    pBVar6 = local_358;
    IRBuilder::createBr(this_00,local_358);
    IRBuilder::setInsertPoint(this_00,pBVar6);
    this->result_ = pVVar7;
    pVVar7 = extraout_RAX;
  }
  else {
    (**(code **)(**(long **)(lVar9 + 0x48) + 0x10))(*(long **)(lVar9 + 0x48),this,__addr);
    pVVar7 = this->result_;
    __addr_00 = this;
    (**(code **)(**(long **)(lVar9 + 0x50) + 0x10))();
    pVVar3 = this->result_;
    uVar2 = *(ushort *)(lVar9 + 0x40);
    __addr_len_00 =
         (socklen_t *)
         ((ulong)uVar2 % accept(flow::lang::BinaryExpr&)::ops_abi_cxx11_._M_h._M_bucket_count &
         0xffffffff);
    p_Var4 = accept(flow::lang::BinaryExpr&)::ops_abi_cxx11_._M_h._M_buckets[(long)__addr_len_00];
    p_Var10 = (__node_base_ptr)0x0;
    if (p_Var4 != (__node_base_ptr)0x0) {
      p_Var10 = p_Var4;
      p_Var11 = p_Var4->_M_nxt;
      if (*(uint *)&p_Var4->_M_nxt[1]._M_nxt != (uint)uVar2) {
        while (p_Var8 = p_Var11->_M_nxt, p_Var8 != (_Hash_node_base *)0x0) {
          __addr_00 = (IRGenerator *)(long)(int)*(uint *)&p_Var8[1]._M_nxt;
          __addr_len_00 =
               (socklen_t *)
               ((ulong)__addr_00 %
               accept(flow::lang::BinaryExpr&)::ops_abi_cxx11_._M_h._M_bucket_count);
          p_Var10 = (__node_base_ptr)0x0;
          if ((__addr_len_00 !=
               (socklen_t *)
               ((ulong)uVar2 % accept(flow::lang::BinaryExpr&)::ops_abi_cxx11_._M_h._M_bucket_count)
              ) || (p_Var10 = p_Var11, p_Var11 = p_Var8, *(uint *)&p_Var8[1]._M_nxt == (uint)uVar2))
          goto LAB_001248ea;
        }
        p_Var10 = (__node_base_ptr)0x0;
      }
    }
LAB_001248ea:
    if (p_Var10 == (__node_base_ptr)0x0) {
      p_Var8 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var8 = p_Var10->_M_nxt;
    }
    if (p_Var8 == (_Hash_node_base *)0x0) {
      iVar5 = accept((uint)uVar2,(sockaddr *)__addr_00,__addr_len_00);
      __cxa_guard_abort(&accept(flow::lang::BinaryExpr&)::ops_abi_cxx11_);
      _Unwind_Resume(iVar5);
    }
    p_Var12 = p_Var8[2]._M_nxt;
    plVar13 = (long *)((long)&(this->super_ASTVisitor)._vptr_ASTVisitor +
                      (long)&(p_Var8[3]._M_nxt)->_M_nxt);
    if (((ulong)p_Var12 & 1) != 0) {
      p_Var12 = *(_Hash_node_base **)(*plVar13 + -1 + (long)p_Var12);
    }
    local_348[0]._M_dataplus._M_p = (pointer)&local_348[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"");
    pVVar7 = (Value *)(*(code *)p_Var12)(plVar13,pVVar7,pVVar3,local_348);
    this->result_ = pVVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348[0]._M_dataplus._M_p != &local_348[0].field_2) {
      operator_delete(local_348[0]._M_dataplus._M_p,local_348[0].field_2._M_allocated_capacity + 1);
      pVVar7 = extraout_RAX_00;
    }
  }
  return (int)pVVar7;
}

Assistant:

void IRGenerator::accept(BinaryExpr& expr) {
  static const std::unordered_map<
      int /*Opcode*/,
      Value* (IRGenerator::*)(Value*, Value*, const std::string&)> ops =
      {// boolean
       {Opcode::BAND, &IRGenerator::createBAnd},
       {Opcode::BXOR, &IRGenerator::createBXor},
       // numerical
       {Opcode::NADD, &IRGenerator::createAdd},
       {Opcode::NSUB, &IRGenerator::createSub},
       {Opcode::NMUL, &IRGenerator::createMul},
       {Opcode::NDIV, &IRGenerator::createDiv},
       {Opcode::NREM, &IRGenerator::createRem},
       {Opcode::NSHL, &IRGenerator::createShl},
       {Opcode::NSHR, &IRGenerator::createShr},
       {Opcode::NPOW, &IRGenerator::createPow},
       {Opcode::NAND, &IRGenerator::createAnd},
       {Opcode::NOR, &IRGenerator::createOr},
       {Opcode::NXOR, &IRGenerator::createXor},
       {Opcode::NCMPEQ, &IRGenerator::createNCmpEQ},
       {Opcode::NCMPNE, &IRGenerator::createNCmpNE},
       {Opcode::NCMPLE, &IRGenerator::createNCmpLE},
       {Opcode::NCMPGE, &IRGenerator::createNCmpGE},
       {Opcode::NCMPLT, &IRGenerator::createNCmpLT},
       {Opcode::NCMPGT, &IRGenerator::createNCmpGT},

       // string
       {Opcode::SADD, &IRGenerator::createSAdd},
       {Opcode::SCMPEQ, &IRGenerator::createSCmpEQ},
       {Opcode::SCMPNE, &IRGenerator::createSCmpNE},
       {Opcode::SCMPLE, &IRGenerator::createSCmpLE},
       {Opcode::SCMPGE, &IRGenerator::createSCmpGE},
       {Opcode::SCMPLT, &IRGenerator::createSCmpLT},
       {Opcode::SCMPGT, &IRGenerator::createSCmpGT},
       {Opcode::SCMPBEG, &IRGenerator::createSCmpEB},
       {Opcode::SCMPEND, &IRGenerator::createSCmpEE},
       {Opcode::SCONTAINS, &IRGenerator::createSIn},

       // regex
       {Opcode::SREGMATCH, &IRGenerator::createSCmpRE},

       // ip
       {Opcode::PCMPEQ, &IRGenerator::createPCmpEQ},
       {Opcode::PCMPNE, &IRGenerator::createPCmpNE},
       {Opcode::PINCIDR, &IRGenerator::createPInCidr}, };

  if (expr.op() == Opcode::BOR) {
    // (lhs || rhs)
    //
    //   L = lhs();
    //   if (L) goto end;
    //   R = rhs();
    //   L = R;
    // end:
    //   result = L;

    BasicBlock* borLeft = createBlock("bor.left");
    BasicBlock* borRight = createBlock("bor.right");
    BasicBlock* borCont = createBlock("bor.cont");

    AllocaInstr* result = createAlloca(LiteralType::Boolean, get(1), "bor");
    Value* lhs = codegen(expr.leftExpr());
    createCondBr(lhs, borLeft, borRight);

    setInsertPoint(borLeft);
    createStore(result, lhs, "bor.left");
    createBr(borCont);

    setInsertPoint(borRight);
    Value* rhs = codegen(expr.rightExpr());
    createStore(result, rhs, "bor.right");
    createBr(borCont);

    setInsertPoint(borCont);

    result_ = result;

    return;
  }

  Value* lhs = codegen(expr.leftExpr());
  Value* rhs = codegen(expr.rightExpr());

  auto i = ops.find(expr.op());
  if (i != ops.end()) {
    result_ = (this->*i->second)(lhs, rhs, "");
  } else {
    fprintf(stderr, "BUG: Binary operation `%s` not implemented.\n",
            mnemonic(expr.op()));
    assert(!"Unimplemented");
    result_ = nullptr;
  }
}